

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.h
# Opt level: O2

void __thiscall CompressedHeader::CompressedHeader(CompressedHeader *this,CBlockHeader *header)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  base_blob<256U> *pbVar9;
  uint32_t uVar10;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  this->nBits = 0;
  this->nNonce = 0;
  pbVar9 = &(this->hashMerkleRoot).super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0xc] = '\0';
  (pbVar9->m_data)._M_elems[0xd] = '\0';
  (pbVar9->m_data)._M_elems[0xe] = '\0';
  (pbVar9->m_data)._M_elems[0xf] = '\0';
  (pbVar9->m_data)._M_elems[0x10] = '\0';
  (pbVar9->m_data)._M_elems[0x11] = '\0';
  (pbVar9->m_data)._M_elems[0x12] = '\0';
  (pbVar9->m_data)._M_elems[0x13] = '\0';
  pbVar9 = &(this->hashMerkleRoot).super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x14] = '\0';
  (pbVar9->m_data)._M_elems[0x15] = '\0';
  (pbVar9->m_data)._M_elems[0x16] = '\0';
  (pbVar9->m_data)._M_elems[0x17] = '\0';
  (pbVar9->m_data)._M_elems[0x18] = '\0';
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  (pbVar9->m_data)._M_elems[0x1a] = '\0';
  (pbVar9->m_data)._M_elems[0x1b] = '\0';
  this->nVersion = 0;
  (this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar9 = &(this->hashMerkleRoot).super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[4] = '\0';
  (pbVar9->m_data)._M_elems[5] = '\0';
  (pbVar9->m_data)._M_elems[6] = '\0';
  (pbVar9->m_data)._M_elems[7] = '\0';
  (pbVar9->m_data)._M_elems[8] = '\0';
  (pbVar9->m_data)._M_elems[9] = '\0';
  (pbVar9->m_data)._M_elems[10] = '\0';
  (pbVar9->m_data)._M_elems[0xb] = '\0';
  this->nVersion = header->nVersion;
  uVar2 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 4);
  uVar3 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar5 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar6 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar7 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar8 = *(undefined4 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c);
  *(undefined4 *)(this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems =
       *(undefined4 *)(header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 4) = uVar2;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar4;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar5;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x14) = uVar6;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
  *(undefined4 *)((this->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x1c) = uVar8;
  uVar10 = header->nBits;
  this->nTime = header->nTime;
  this->nBits = uVar10;
  this->nNonce = header->nNonce;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CompressedHeader(const CBlockHeader& header)
    {
        nVersion = header.nVersion;
        hashMerkleRoot = header.hashMerkleRoot;
        nTime = header.nTime;
        nBits = header.nBits;
        nNonce = header.nNonce;
    }